

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O0

int cReadValues(FILE *fp,int n,singlecomplex *destination,int perline,int persize)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  char local_a8 [8];
  char buf [100];
  char tmp;
  float realpart;
  int pair;
  int s;
  int k;
  int j;
  int i;
  int persize_local;
  int perline_local;
  singlecomplex *destination_local;
  int n_local;
  FILE *fp_local;
  
  bVar1 = false;
  k = 0;
  while (k < n) {
    fgets(local_a8,100,(FILE *)fp);
    for (s = 0; s < perline && k < n; s = s + 1) {
      buf[0x5f] = local_a8[(s + 1) * persize];
      local_a8[(s + 1) * persize] = '\0';
      iVar2 = s * persize;
      for (pair = 0; pair < persize; pair = pair + 1) {
        if ((local_a8[iVar2 + pair] == 'D') || (local_a8[iVar2 + pair] == 'd')) {
          local_a8[iVar2 + pair] = 'E';
        }
      }
      if (bVar1) {
        destination[k].r = (float)buf._96_4_;
        dVar3 = atof(local_a8 + iVar2);
        destination[k].i = (float)dVar3;
        k = k + 1;
      }
      else {
        dVar3 = atof(local_a8 + iVar2);
        buf._96_4_ = (float)dVar3;
      }
      bVar1 = !bVar1;
      local_a8[(s + 1) * persize] = buf[0x5f];
    }
  }
  return 0;
}

Assistant:

int cReadValues(FILE *fp, int n, singlecomplex *destination, int perline, int persize)
{
    register int i, j, k, s, pair;
    register float realpart;
    char tmp, buf[100];
    
    i = pair = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    if ( pair == 0 ) {
	  	/* The value is real part */
		realpart = atof(&buf[s]);
		pair = 1;
	    } else {
		/* The value is imaginary part */
	        destination[i].r = realpart;
		destination[i++].i = atof(&buf[s]);
		pair = 0;
	    }
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}